

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  size_t *psVar1;
  ptls_buffer_t *buf_00;
  byte *pbVar2;
  undefined1 auVar3 [16];
  uint8_t uVar4;
  st_ptls_get_time_t *psVar5;
  ptls_cipher_suite_t *ppVar6;
  st_ptls_key_schedule_t *psVar7;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var8;
  st_ptls_verify_certificate_t *psVar9;
  uint8_t *puVar10;
  size_t sVar11;
  st_ptls_save_ticket_t *psVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ptls_key_exchange_context_t *ppVar16;
  void *pvVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ptls_iovec_t pVar20;
  undefined1 auVar21 [16];
  long lVar22;
  uint6 uVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  uint64_t uVar27;
  ushort *puVar28;
  ushort *puVar29;
  int iVar30;
  char *context_string;
  uint8_t *puVar31;
  ushort uVar32;
  ushort uVar33;
  ushort *puVar34;
  ushort *puVar35;
  ushort uVar36;
  ulong uVar37;
  ulong uVar38;
  ptls_cipher_suite_t **pppVar39;
  ushort *puVar40;
  long lVar41;
  ptls_buffer_t *ppVar42;
  long lVar43;
  ptls_hash_context_t **pppVar44;
  uint8_t *puVar45;
  size_t sVar46;
  uint8_t *puVar47;
  uint8_t *puVar48;
  size_t sVar49;
  bool bVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ptls_iovec_t message;
  ptls_iovec_t pVar55;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_iovec_t pVar56;
  ptls_iovec_t pVar57;
  ptls_iovec_t message_02;
  ptls_buffer_t ticket_buf;
  ptls_iovec_t ticket_nonce;
  uint32_t ticket_age_add;
  uint32_t max_early_data_size;
  st_ptls_server_hello_t sh;
  ptls_iovec_t local_2e8;
  undefined1 local_2d8 [16];
  ptls_iovec_t local_2c0;
  ushort *local_2b0;
  undefined1 local_2a8 [16];
  uint8_t *local_298;
  ptls_handshake_properties_t *local_290;
  uint32_t local_288 [2];
  st_ptls_key_schedule_t *local_280;
  uint32_t local_274;
  uint8_t *local_270;
  uint local_264;
  st_ptls_traffic_protection_t *local_260;
  undefined8 *local_258;
  void **local_250;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **local_248;
  anon_union_64_2_21cbdc79_for_st_ptls_t_19 *local_240;
  undefined1 local_238 [8];
  uint8_t *puStack_230;
  undefined1 local_228 [16];
  ptls_iovec_t local_218;
  undefined1 local_208 [8];
  undefined1 auStack_200 [16];
  size_t sStack_1f0;
  
  auVar3 = local_2a8;
  local_290 = properties;
  buf = &tls->recvbuf;
  puVar47 = (tls->recvbuf).rec.base;
  if ((puVar47 == (uint8_t *)0x0) && ((uint8_t *)0x4 < (uint8_t *)*inlen)) {
    local_2a8[0] = *input;
    auVar21 = local_2a8;
    local_2a8._4_12_ = auVar3._4_12_;
    local_2a8._0_2_ = auVar21._0_2_;
    local_2a8._2_2_ = *(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8;
    uVar33 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    local_2a8._8_2_ = uVar33;
    local_2a8._10_6_ = 0;
    uVar37 = (ulong)(*input == '\x17') << 8 | 0x4000;
    uVar24 = 0x32;
    if (uVar33 <= uVar37) {
      uVar24 = 0;
    }
    if ((uint)uVar33 <= (uint)uVar37) {
      puVar45 = (uint8_t *)((ulong)uVar33 + 5);
      if ((uint8_t *)*inlen < puVar45) goto LAB_0019f734;
      local_298 = (uint8_t *)((long)input + 5);
      uVar24 = 0;
      goto LAB_0019f8f9;
    }
  }
  else {
LAB_0019f734:
    sVar46 = *inlen;
    local_2a8 = (undefined1  [16])0x0;
    local_298 = (uint8_t *)0x0;
    if (puVar47 == (uint8_t *)0x0) {
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      uVar24 = ptls_buffer_reserve(&buf->rec,5);
      if (uVar24 != 0) goto LAB_0019f8fd;
    }
    auVar3 = local_2a8;
    uVar37 = (tls->recvbuf).rec.off;
    sVar26 = sVar46;
    puVar45 = (uint8_t *)input;
    while (uVar37 < 5) {
      if (sVar26 == 0) {
        uVar24 = 0x202;
        goto LAB_0019f8fd;
      }
      uVar4 = *puVar45;
      puVar45 = puVar45 + 1;
      puVar47 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar37 + 1;
      puVar47[uVar37] = uVar4;
      sVar26 = sVar26 - 1;
      uVar37 = (tls->recvbuf).rec.off;
    }
    puVar47 = (buf->rec).base;
    local_2a8[0] = *puVar47;
    auVar21 = local_2a8;
    local_2a8._4_12_ = auVar3._4_12_;
    local_2a8._0_2_ = auVar21._0_2_;
    local_2a8._2_2_ = *(ushort *)(puVar47 + 1) << 8 | *(ushort *)(puVar47 + 1) >> 8;
    uVar33 = *(ushort *)(puVar47 + 3) << 8 | *(ushort *)(puVar47 + 3) >> 8;
    local_2a8._8_2_ = uVar33;
    local_2a8._10_6_ = 0;
    uVar38 = (ulong)(*puVar47 == '\x17') << 8 | 0x4000;
    uVar24 = 0x32;
    if (uVar33 <= uVar38) {
      uVar24 = 0;
    }
    if ((uint)uVar33 <= (uint)uVar38) {
      lVar41 = (long)input + sVar46;
      sVar46 = (ulong)uVar33 + 5;
      uVar37 = sVar46 - uVar37;
      if (uVar37 != 0) {
        uVar24 = ptls_buffer_reserve(&buf->rec,uVar37);
        if (uVar24 != 0) goto LAB_0019f8fd;
        uVar38 = lVar41 - (long)puVar45;
        if (uVar37 < uVar38) {
          uVar38 = uVar37;
        }
        if (uVar38 != 0) {
          memcpy((tls->recvbuf).rec.base + (tls->recvbuf).rec.off,puVar45,uVar38);
          psVar1 = &(tls->recvbuf).rec.off;
          *psVar1 = *psVar1 + uVar38;
          puVar45 = puVar45 + uVar38;
        }
      }
      uVar24 = 0x202;
      if ((tls->recvbuf).rec.off == sVar46) {
        local_298 = (buf->rec).base + 5;
        uVar24 = 0;
      }
      puVar45 = puVar45 + (*inlen - lVar41);
LAB_0019f8f9:
      *inlen = (size_t)puVar45;
    }
  }
LAB_0019f8fd:
  puVar47 = local_298;
  if (uVar24 != 0) {
    return uVar24;
  }
  if (local_298 == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                  ,0xce7,
                  "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  uVar14 = local_2a8._8_8_;
  if (local_2a8[0] == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_2a8._8_8_ != 1) {
      return 0x2f;
    }
    uVar24 = 0x202;
    if (*local_298 != '\x01') {
      return 0x2f;
    }
  }
  else {
    if ((local_2a8[0] == '\x15') ||
       ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      if ((local_2a8[0] == '\x17') && (uVar24 = 0x202, (tls->field_0x138 & 4) != 0))
      goto LAB_001a193d;
    }
    else {
      if (local_2a8[0] != '\x17') {
        return 0x28;
      }
      uVar24 = ptls_buffer_reserve(decryptbuf,local_2a8._8_8_ + 5);
      if (uVar24 != 0) {
        return uVar24;
      }
      uVar25 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                            (size_t *)(local_2a8 + 8),puVar47,uVar14);
      if (uVar25 != 0) {
        uVar24 = 0x202;
        if ((tls->field_0x138 & 4) == 0) {
          return uVar25;
        }
        goto LAB_001a193d;
      }
      local_298 = decryptbuf->base + decryptbuf->off;
      bVar50 = local_2a8._8_8_ == 0;
      if (bVar50) {
        return 10;
      }
      lVar41 = local_2a8._8_8_;
      if (local_298[local_2a8._8_8_ + -1] == '\0') {
        lVar43 = local_2a8._8_8_;
        do {
          bVar50 = lVar43 == 1;
          if (bVar50) {
            return 10;
          }
          lVar41 = lVar43 + -1;
          lVar22 = lVar43 + (decryptbuf->off - 2);
          lVar43 = lVar41;
        } while (decryptbuf->base[lVar22] == '\0');
      }
      if (bVar50) {
        return 10;
      }
      local_2a8._8_8_ = lVar41 + -1;
      local_2a8[0] = local_298[lVar41 + -1];
    }
    puVar47 = (tls->recvbuf).mess.base;
    uVar14 = local_2a8._8_8_;
    if (local_2a8[0] == '\x16' || puVar47 != (uint8_t *)0x0) {
      uVar24 = 0x32;
      if (local_2a8[0] == '\x16') {
        buf_00 = &(tls->recvbuf).mess;
        puVar45 = local_298;
        sVar46 = local_2a8._8_8_;
        if (puVar47 != (uint8_t *)0x0) {
          uVar24 = ptls_buffer_reserve(buf_00,local_2a8._8_8_);
          if (uVar24 != 0) goto LAB_001a193d;
          memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,local_298,uVar14);
          sVar46 = uVar14 + (tls->recvbuf).mess.off;
          (tls->recvbuf).mess.off = sVar46;
          puVar45 = (tls->recvbuf).mess.base;
        }
        puVar47 = puVar45 + sVar46;
        local_240 = &tls->field_15;
        local_260 = &(tls->traffic_protection).enc;
        local_248 = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)((long)&tls->field_15 + 0x18);
        local_250 = (void **)((long)&tls->field_15 + 0x20);
        local_258 = (undefined8 *)((long)&tls->field_15 + 0x10);
        uVar25 = 0x202;
        do {
          sVar46 = (long)puVar47 - (long)puVar45;
          if ((long)sVar46 < 4) goto LAB_001a18ee;
          uVar37 = (ulong)((uint)puVar45[2] << 8 | (uint)puVar45[1] << 0x10);
          sVar26 = puVar45[3] + uVar37 + 4;
          iVar30 = 3;
          if ((long)sVar26 <= (long)sVar46) {
            if (0xb < tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
              __assert_fail("!\"unexpected state\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                            ,0xc85,
                            "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                           );
            }
            uVar37 = uVar37 | puVar45[3];
            uVar4 = *puVar45;
            uVar25 = 10;
            uVar24 = (uint)uVar37;
            switch(tls->state) {
            default:
              if ((sVar46 == sVar26) && (uVar4 == '\x02')) {
                local_2e8.base = (uint8_t *)0x0;
                local_2e8.len = 0;
                local_2c0.base = puVar45 + 4;
                local_238 = (undefined1  [8])0x0;
                puStack_230 = (uint8_t *)0x0;
                local_228 = (undefined1  [16])0x0;
                local_218.base = (uint8_t *)0x0;
                local_218.len = 0;
                _local_208 = (undefined1  [16])0x0;
                auStack_200._8_8_ = (uint8_t *)0x0;
                sStack_1f0 = 0;
                uVar25 = 0x32;
                if ((1 < uVar24) && (local_2c0.base = puVar45 + 6, 0x21 < uVar24)) {
                  auVar52[0] = -(puVar45[6] == 0xcf);
                  auVar52[1] = -(puVar45[7] == '!');
                  auVar52[2] = -(puVar45[8] == 0xad);
                  auVar52[3] = -(puVar45[9] == 't');
                  auVar52[4] = -(puVar45[10] == 0xe5);
                  auVar52[5] = -(puVar45[0xb] == 0x9a);
                  auVar52[6] = -(puVar45[0xc] == 'a');
                  auVar52[7] = -(puVar45[0xd] == '\x11');
                  auVar52[8] = -(puVar45[0xe] == 0xbe);
                  auVar52[9] = -(puVar45[0xf] == '\x1d');
                  auVar52[10] = -(puVar45[0x10] == 0x8c);
                  auVar52[0xb] = -(puVar45[0x11] == '\x02');
                  auVar52[0xc] = -(puVar45[0x12] == '\x1e');
                  auVar52[0xd] = -(puVar45[0x13] == 'e');
                  auVar52[0xe] = -(puVar45[0x14] == 0xb8);
                  auVar52[0xf] = -(puVar45[0x15] == 0x91);
                  auVar53[0] = -(puVar45[0x16] == 0xc2);
                  auVar53[1] = -(puVar45[0x17] == 0xa2);
                  auVar53[2] = -(puVar45[0x18] == '\x11');
                  auVar53[3] = -(puVar45[0x19] == '\x16');
                  auVar53[4] = -(puVar45[0x1a] == 'z');
                  auVar53[5] = -(puVar45[0x1b] == 0xbb);
                  auVar53[6] = -(puVar45[0x1c] == 0x8c);
                  auVar53[7] = -(puVar45[0x1d] == '^');
                  auVar53[8] = -(puVar45[0x1e] == '\a');
                  auVar53[9] = -(puVar45[0x1f] == 0x9e);
                  auVar53[10] = -(puVar45[0x20] == '\t');
                  auVar53[0xb] = -(puVar45[0x21] == 0xe2);
                  auVar53[0xc] = -(puVar45[0x22] == 200);
                  auVar53[0xd] = -(puVar45[0x23] == 0xa8);
                  auVar53[0xe] = -(puVar45[0x24] == '3');
                  auVar53[0xf] = -(puVar45[0x25] == 0x9c);
                  auVar53 = auVar53 & auVar52;
                  local_208[0] = (ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar53[0xf] >> 7) << 0xf) == 0xffff;
                  local_208._1_3_ = 0;
                  stack0xfffffffffffffdfc = SUB1612((undefined1  [16])0x0,4);
                  local_2c0.base = puVar45 + 0x26;
                  if ((uint)sVar26 != 0x26) {
                    local_2c0.base = puVar45 + 0x27;
                    uVar38 = (ulong)puVar45[0x26];
                    if ((uVar38 < 0x21) && (uVar38 <= uVar37 - 0x23)) {
                      puVar28 = (ushort *)(puVar45 + sVar26);
                      puVar34 = (ushort *)((long)local_2c0.base + uVar38);
                      local_218.len._0_1_ = puVar45[0x26];
                      local_218.base = local_2c0.base;
                      local_218.len._1_7_ = 0;
                      local_2c0.base = (uint8_t *)puVar34;
                      if ((long)puVar28 - (long)puVar34 < 2) {
                        bVar50 = false;
                      }
                      else {
                        local_2c0.base = (uint8_t *)(puVar34 + 1);
                        pppVar39 = tls->ctx->cipher_suites;
                        ppVar6 = *pppVar39;
                        while ((ppVar6 != (ptls_cipher_suite_t *)0x0 &&
                               (pppVar39 = pppVar39 + 1,
                               ppVar6->id != (uint16_t)(*puVar34 << 8 | *puVar34 >> 8)))) {
                          ppVar6 = *pppVar39;
                        }
                        tls->cipher_suite = ppVar6;
                        bVar50 = ppVar6 != (ptls_cipher_suite_t *)0x0;
                        uVar25 = 0x2f;
                        if (bVar50) {
                          uVar25 = 0;
                        }
                      }
                      puVar31 = local_2c0.base;
                      if (bVar50) {
                        if ((ushort *)local_2c0.base != puVar28) {
                          local_2c0.base = (uint8_t *)((long)local_2c0.base + 1);
                          if (*puVar31 == '\0') {
                            if ((bool)local_208[0]) {
                              auStack_200._0_2_ = 0xffff;
                              auStack_200._2_6_ = 0;
                            }
                            local_288[0] = 0x12421;
                            local_288[1] = 0x2400;
                            uVar33 = 0xffff;
                            if ((ulong)((long)puVar28 - (long)local_2c0.base) < 2) {
LAB_001a127b:
                              bVar50 = false;
                              local_2b0 = (ushort *)CONCAT62(local_2b0._2_6_,0xffff);
                              uVar25 = 0x32;
                            }
                            else {
                              lVar41 = 0;
                              uVar37 = 0;
                              do {
                                uVar37 = (ulong)*(byte *)((long)local_2c0.base + lVar41) |
                                         uVar37 << 8;
                                lVar41 = lVar41 + 1;
                              } while (lVar41 != 2);
                              local_2c0.base = (uint8_t *)((long)puVar31 + 3);
                              if ((ulong)((long)puVar28 - (long)local_2c0.base) < uVar37)
                              goto LAB_001a127b;
                              bVar50 = true;
                              if (uVar37 == 0) {
                                local_2b0 = (ushort *)CONCAT62(local_2b0._2_6_,0xffff);
                              }
                              else {
                                puVar34 = (ushort *)(uVar37 + (long)local_2c0.base);
                                local_2b0 = (ushort *)CONCAT62(local_2b0._2_6_,0xffff);
                                uVar33 = 0xffff;
                                do {
                                  puVar31 = local_2c0.base;
                                  uVar25 = 0x32;
                                  if ((long)puVar34 - (long)local_2c0.base < 2) {
LAB_001a181a:
                                    bVar50 = false;
                                    break;
                                  }
                                  uVar36 = *(ushort *)local_2c0.base;
                                  uVar32 = uVar36 << 8 | uVar36 >> 8;
                                  puVar35 = (ushort *)((long)local_2c0.base + 2);
                                  local_2c0.base = (uint8_t *)puVar35;
                                  uVar24 = (uint)uVar32;
                                  if (uVar32 < 0x40) {
                                    if ((*(byte *)((long)local_288 + (ulong)(uVar32 >> 3)) >>
                                         (uVar24 & 7) & 1) != 0) {
                                      uVar25 = 0x2f;
                                      goto LAB_001a181a;
                                    }
                                    pbVar2 = (byte *)((long)local_288 + (ulong)(uVar32 >> 3));
                                    *pbVar2 = *pbVar2 | (byte)(1 << ((byte)(uVar36 >> 8) & 7));
                                  }
                                  uVar25 = 0x32;
                                  bVar51 = true;
                                  if (1 < (ulong)((long)puVar34 - (long)puVar35)) {
                                    lVar41 = 0;
                                    uVar37 = 0;
                                    do {
                                      uVar37 = (ulong)*(byte *)((long)puVar35 + lVar41) |
                                               uVar37 << 8;
                                      lVar41 = lVar41 + 1;
                                    } while (lVar41 != 2);
                                    local_2c0.base = (uint8_t *)((long)puVar31 + 4);
                                    if (uVar37 <= (ulong)((long)puVar34 - (long)local_2c0.base)) {
                                      puVar29 = (ushort *)((long)local_2c0.base + uVar37);
                                      if (uVar24 < 0x2c) {
                                        if (uVar24 == 0x29) {
                                          uVar25 = 0x2f;
                                          if (local_208._0_4_ != 0) goto LAB_001a168d;
                                          uVar25 = 0x32;
                                          if (1 < (long)uVar37) {
                                            local_2b0 = (ushort *)
                                                        CONCAT62(local_2b0._2_6_,
                                                                 *(ushort *)((long)puVar31 + 4) << 8
                                                                 | *(ushort *)((long)puVar31 + 4) >>
                                                                   8);
                                            goto LAB_001a1666;
                                          }
LAB_001a1671:
                                          if ((long)uVar37 < 2) goto LAB_001a168d;
                                        }
                                        else {
                                          if (uVar24 == 0x2b) {
                                            uVar25 = 0x32;
                                            if (1 < (long)uVar37) {
                                              uVar33 = *(ushort *)((long)puVar31 + 4) << 8 |
                                                       *(ushort *)((long)puVar31 + 4) >> 8;
LAB_001a1666:
                                              local_2c0.base = (uint8_t *)((long)puVar31 + 6);
                                              uVar25 = 0;
                                            }
                                            goto LAB_001a1671;
                                          }
LAB_001a1635:
                                          local_2c0.base = (uint8_t *)puVar29;
                                        }
                                        uVar25 = 0;
LAB_001a1679:
                                        bVar51 = (ushort *)local_2c0.base != puVar29;
                                        if (bVar51) {
                                          uVar25 = 0x32;
                                        }
                                      }
                                      else if (uVar24 == 0x2c) {
                                        if (local_208._0_4_ == 0) {
                                          uVar25 = 0x2f;
                                        }
                                        else {
                                          uVar25 = 0x32;
                                          bVar51 = true;
                                          if (uVar37 < 2) {
                                            bVar13 = false;
                                          }
                                          else {
                                            lVar41 = 0;
                                            uVar37 = 0;
                                            do {
                                              uVar37 = (ulong)*(byte *)((long)local_2c0.base +
                                                                       lVar41) | uVar37 << 8;
                                              lVar41 = lVar41 + 1;
                                            } while (lVar41 != 2);
                                            puVar40 = (ushort *)((long)puVar31 + 6);
                                            local_2c0.base = (uint8_t *)puVar40;
                                            bVar13 = false;
                                            if (uVar37 - 1 < (ulong)((long)puVar29 - (long)puVar40))
                                            {
                                              local_2c0.base =
                                                   (uint8_t *)((long)puVar35 + uVar37 + 4);
                                              sStack_1f0 = (long)local_2c0.base - (long)puVar40;
                                              auStack_200._8_8_ = puVar40;
                                              bVar13 = true;
                                              bVar51 = false;
                                              uVar25 = 0;
                                            }
                                          }
                                          if (bVar13) {
                                            if ((ushort *)local_2c0.base == puVar29)
                                            goto LAB_001a1679;
                                            uVar25 = 0x32;
                                            bVar51 = true;
                                          }
                                        }
                                      }
                                      else {
                                        if (uVar24 != 0x33) goto LAB_001a1635;
                                        if (local_208._0_4_ != 0) {
                                          uVar25 = 0x32;
                                          if (1 < (long)uVar37) {
                                            auStack_200._0_2_ =
                                                 *(ushort *)((long)puVar31 + 4) << 8 |
                                                 *(ushort *)((long)puVar31 + 4) >> 8;
                                            goto LAB_001a1666;
                                          }
                                          goto LAB_001a1671;
                                        }
                                        uVar25 = decode_key_share_entry
                                                           ((uint16_t *)&local_274,
                                                            (ptls_iovec_t *)auStack_200,
                                                            &local_2c0.base,(uint8_t *)puVar29);
                                        bVar51 = true;
                                        if (uVar25 == 0) {
                                          if ((ushort *)local_2c0.base != puVar29) {
                                            uVar25 = 0x32;
                                            goto LAB_001a1700;
                                          }
                                          uVar25 = 0x2f;
                                          if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0
                                             ) goto LAB_001a1700;
                                          bVar13 = false;
                                          if (tls->key_share->id == (uint16_t)local_274) {
                                            bVar13 = true;
                                            bVar51 = false;
                                            uVar25 = 0;
                                          }
                                        }
                                        else {
LAB_001a1700:
                                          bVar13 = false;
                                        }
                                        if (bVar13) goto LAB_001a1679;
                                      }
                                    }
                                  }
LAB_001a168d:
                                  if (bVar51) goto LAB_001a181a;
                                } while ((ushort *)local_2c0.base != puVar34);
                              }
                            }
                            if ((bVar50) && (uVar25 = 0x32, (ushort *)local_2c0.base == puVar28)) {
                              lVar41 = 0;
                              do {
                                puVar28 = (ushort *)((long)supported_versions + lVar41);
                                if (*puVar28 == uVar33) break;
                                bVar50 = lVar41 != 4;
                                lVar41 = lVar41 + 2;
                              } while (bVar50);
                              if (*puVar28 == uVar33) {
                                if (local_208._0_4_ == 0) {
                                  if ((short)local_2b0 != -1) {
                                    if (((short)local_2b0 != 0) ||
                                       (((tls->field_15).server.pending_traffic_secret[0x28] & 1) ==
                                        0)) goto LAB_001a17e6;
                                    tls->field_0x138 = tls->field_0x138 | 2;
                                  }
                                  if (((uint8_t *)auStack_200._0_8_ == (uint8_t *)0x0) &&
                                     (uVar25 = 0x2f, (tls->field_0x138 & 2) == 0))
                                  goto LAB_0019fcf5;
                                }
                                uVar25 = 0;
                              }
                              else {
LAB_001a17e6:
                                uVar25 = 0x2f;
                              }
                            }
                            goto LAB_0019fcf5;
                          }
                        }
                        uVar25 = 0x2f;
                      }
                    }
                  }
                }
LAB_0019fcf5:
                if (uVar25 == 0) {
                  uVar25 = 0x2f;
                  if (local_218.len == 0x10) {
                    auVar3 = *(undefined1 (*) [16])local_218.base;
                    auVar54[0] = -((tls->field_15).client.legacy_session_id[0] == auVar3[0]);
                    auVar54[1] = -((tls->field_15).client.legacy_session_id[1] == auVar3[1]);
                    auVar54[2] = -((tls->field_15).client.legacy_session_id[2] == auVar3[2]);
                    auVar54[3] = -((tls->field_15).client.legacy_session_id[3] == auVar3[3]);
                    auVar54[4] = -((tls->field_15).client.legacy_session_id[4] == auVar3[4]);
                    auVar54[5] = -((tls->field_15).client.legacy_session_id[5] == auVar3[5]);
                    auVar54[6] = -((tls->field_15).client.legacy_session_id[6] == auVar3[6]);
                    auVar54[7] = -((tls->field_15).client.legacy_session_id[7] == auVar3[7]);
                    auVar54[8] = -((tls->field_15).client.legacy_session_id[8] == auVar3[8]);
                    auVar54[9] = -((tls->field_15).client.legacy_session_id[9] == auVar3[9]);
                    auVar54[10] = -((tls->field_15).client.legacy_session_id[10] == auVar3[10]);
                    auVar54[0xb] = -((tls->field_15).client.legacy_session_id[0xb] == auVar3[0xb]);
                    auVar54[0xc] = -((tls->field_15).client.legacy_session_id[0xc] == auVar3[0xc]);
                    auVar54[0xd] = -((tls->field_15).client.legacy_session_id[0xd] == auVar3[0xd]);
                    auVar54[0xe] = -((tls->field_15).client.legacy_session_id[0xe] == auVar3[0xe]);
                    auVar54[0xf] = -((tls->field_15).client.legacy_session_id[0xf] == auVar3[0xf]);
                    if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar54[0xf] >> 7) << 0xf) == 0xffff) {
                      if (local_208._0_4_ == 0) {
                        uVar24 = 0;
                        if (((tls->field_15).server.pending_traffic_secret[0x28] & 1) != 0) {
                          uVar24 = (uint)((tls->field_0x138 & 2) == 0);
                        }
                        uVar25 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar24)
                        ;
                        if ((uVar25 == 0) &&
                           (((uint8_t *)auStack_200._0_8_ == (uint8_t *)0x0 ||
                            (uVar25 = (**(code **)*local_258)(local_258,&local_2e8), uVar25 == 0))))
                        {
                          psVar7 = tls->key_schedule;
                          if (psVar7->num_hashes != 0) {
                            pppVar44 = &psVar7->hashes[0].ctx;
                            sVar46 = 0;
                            do {
                              (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                              sVar46 = sVar46 + 1;
                              pppVar44 = pppVar44 + 2;
                            } while (sVar46 != psVar7->num_hashes);
                          }
                          uVar25 = key_schedule_extract(tls->key_schedule,local_2e8);
                          if ((uVar25 == 0) &&
                             (uVar25 = setup_traffic_protection
                                                 (tls,0,"s hs traffic",
                                                  "SERVER_HANDSHAKE_TRAFFIC_SECRET"), uVar25 == 0))
                          {
                            tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                            uVar25 = 0x202;
                          }
                        }
                      }
                      else {
                        uVar25 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
                        if (uVar25 == 0) {
                          message_02.len = sVar26;
                          message_02.base = puVar45;
                          uVar25 = handle_hello_retry_request
                                             (tls,sendbuf,(st_ptls_server_hello_t *)local_238,
                                              message_02,local_290);
                          break;
                        }
                      }
                    }
                  }
                }
                if (local_2e8.base != (uint8_t *)0x0) {
                  (*ptls_clear_memory)(local_2e8.base,local_2e8.len);
                  free(local_2e8.base);
                }
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
              if (uVar4 == '\b') {
                puVar28 = (ushort *)(puVar45 + 4);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = local_2e8.len;
                local_2e8 = (ptls_iovec_t)(auVar21 << 0x40);
                pVar20 = local_2e8;
                local_2e8.base._0_2_ = 0x2020;
                pVar55 = local_2e8;
                local_238._0_2_ = 0xffff;
                local_2e8._7_9_ = pVar20._7_9_;
                local_2e8.base._0_6_ = (uint6)pVar55.base;
                uVar23 = (uint6)local_2e8.base;
                local_2e8.base._0_7_ = 0x8000000000000;
                local_2e8.base._0_6_ = uVar23 | 0x3a0000000000;
                uVar25 = 0x32;
                bVar50 = true;
                if (((uint)sVar26 & 0xfffffffe) == 4) {
                  bVar51 = false;
                }
                else {
                  lVar41 = 0;
                  uVar38 = 0;
                  do {
                    uVar38 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar38 << 8;
                    lVar41 = lVar41 + 1;
                  } while (lVar41 != 2);
                  puVar28 = (ushort *)(puVar45 + 6);
                  if (uVar37 - 2 < uVar38) {
                    bVar51 = false;
                  }
                  else {
                    bVar51 = true;
                    if (uVar38 != 0) {
                      puVar35 = (ushort *)(uVar38 + (long)puVar28);
                      bVar50 = true;
                      puVar34 = puVar28;
                      do {
                        uVar25 = 0x32;
                        puVar28 = puVar34;
                        if ((long)puVar35 - (long)puVar34 < 2) {
LAB_001a0e66:
                          bVar51 = false;
                          goto LAB_001a0a81;
                        }
                        uVar33 = *puVar34;
                        uVar36 = uVar33 << 8 | uVar33 >> 8;
                        puVar29 = puVar34 + 1;
                        puVar28 = puVar29;
                        if (uVar36 < 0x40) {
                          if ((*(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) >> (uVar36 & 7) &
                              1) != 0) {
                            uVar25 = 0x2f;
                            goto LAB_001a0e66;
                          }
                          *(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) =
                               *(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) |
                               (byte)(1 << ((byte)(uVar33 >> 8) & 7));
                        }
                        uVar25 = 0x32;
                        if ((ulong)((long)puVar35 - (long)puVar29) < 2) {
LAB_001a0392:
                          bVar51 = false;
                        }
                        else {
                          lVar41 = 0;
                          uVar37 = 0;
                          do {
                            uVar37 = (ulong)*(byte *)((long)puVar29 + lVar41) | uVar37 << 8;
                            lVar41 = lVar41 + 1;
                          } while (lVar41 != 2);
                          puVar28 = puVar34 + 2;
                          if ((ulong)((long)puVar35 - (long)puVar28) < uVar37) goto LAB_001a0392;
                          puVar29 = (ushort *)((long)puVar29 + uVar37 + 2);
                          if (uVar36 == 0x2a) {
                            if (tls->early_data == (st_ptls_early_data_t *)0x0) {
                              uVar25 = 0x2f;
                              goto LAB_001a0392;
                            }
                            bVar50 = false;
LAB_001a045c:
                            uVar25 = 0;
LAB_001a0461:
                            bVar51 = true;
                            puVar28 = puVar29;
                          }
                          else {
                            if (uVar36 == 0x10) {
                              iVar30 = 8;
                              uVar25 = 0x32;
                              if (1 < uVar37) {
                                lVar41 = 0;
                                uVar37 = 0;
                                do {
                                  uVar37 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar37 << 8;
                                  lVar41 = lVar41 + 1;
                                } while (lVar41 != 2);
                                puVar28 = puVar34 + 3;
                                if ((ulong)((long)puVar29 - (long)puVar28) < uVar37) {
                                  iVar30 = 8;
                                }
                                else {
                                  local_2b0 = (ushort *)((long)puVar28 + uVar37);
                                  local_280 = (st_ptls_key_schedule_t *)CONCAT44(local_280._4_4_,8);
                                  uVar25 = 0x32;
                                  if (uVar37 == 0) {
                                    bVar51 = false;
                                  }
                                  else {
                                    local_270 = (uint8_t *)(ulong)(byte)puVar34[3];
                                    puVar28 = (ushort *)((long)puVar34 + 7);
                                    if ((uint8_t *)((long)local_2b0 - (long)puVar28) < local_270) {
                                      bVar51 = false;
                                    }
                                    else {
                                      uVar24 = ptls_set_negotiated_protocol
                                                         (tls,(char *)puVar28,(size_t)local_270);
                                      uVar25 = 0;
                                      if (uVar24 == 0) {
                                        puVar28 = (ushort *)((long)puVar28 + (long)local_270);
                                        bVar51 = true;
                                        local_280 = (st_ptls_key_schedule_t *)
                                                    ((ulong)local_280 & 0xffffffff00000000);
                                      }
                                      else {
                                        bVar51 = false;
                                        uVar25 = uVar24;
                                      }
                                    }
                                  }
                                  if (bVar51) {
                                    if (puVar28 != local_2b0) {
                                      uVar25 = 0x28;
                                    }
                                    iVar30 = (uint)(puVar28 != local_2b0) << 3;
                                  }
                                  else {
                                    iVar30 = (int)local_280;
                                  }
                                }
                              }
                              if (iVar30 == 0) {
                                if (puVar28 == puVar29) goto LAB_001a0461;
                                uVar25 = 0x32;
                              }
                            }
                            else {
                              if (uVar36 != 0) {
                                handle_unknown_extension
                                          (tls,local_290,uVar36,(uint8_t *)puVar28,
                                           (uint8_t *)puVar29,(ptls_raw_extension_t *)local_238);
                                goto LAB_001a045c;
                              }
                              if (uVar37 == 0) {
                                if (tls->server_name != (char *)0x0) {
                                  uVar25 = 0;
                                  goto LAB_001a0461;
                                }
                                uVar25 = 0x2f;
                              }
                            }
                            bVar51 = false;
                          }
                        }
                        if (!bVar51) {
                          bVar51 = false;
                          goto LAB_001a0a81;
                        }
                        puVar34 = puVar28;
                      } while (puVar28 != puVar35);
                      bVar51 = true;
                    }
                  }
                }
LAB_001a0a81:
                if ((bVar51) && (uVar25 = 0x32, puVar28 == (ushort *)(puVar45 + sVar26))) {
                  if (tls->early_data == (st_ptls_early_data_t *)0x0) {
                    uVar25 = setup_traffic_protection
                                       (tls,1,"c hs traffic","CLIENT_HANDSHAKE_TRAFFIC_SECRET");
                  }
                  else {
                    tls->field_0x138 = tls->field_0x138 & 0xfb | bVar50 * '\x04';
                    if (!bVar50 && local_290 != (ptls_handshake_properties_t *)0x0) {
                      puVar31 = (local_290->field_0).server.selected_psk_binder.base + 0x28;
                      *puVar31 = *puVar31 | 1;
                    }
                    uVar25 = derive_secret(tls->key_schedule,tls->early_data,"c hs traffic");
                  }
                  if ((uVar25 == 0) &&
                     (uVar25 = report_unknown_extensions
                                         (tls,local_290,(ptls_raw_extension_t *)local_238),
                     uVar25 == 0)) {
                    psVar7 = tls->key_schedule;
                    if (psVar7->num_hashes != 0) {
                      pppVar44 = &psVar7->hashes[0].ctx;
                      sVar46 = 0;
                      do {
                        (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                        sVar46 = sVar46 + 1;
                        pppVar44 = pppVar44 + 2;
                      } while (sVar46 != psVar7->num_hashes);
                    }
                    tls->state = (byte)tls->field_0x138 &
                                 PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO |
                                 PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
                    uVar25 = 0x202;
                  }
                }
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
              if (uVar4 == '\v') {
                if (uVar37 == 0) {
                  puVar28 = (ushort *)(puVar45 + 4);
                  uVar25 = 0x32;
                  bVar50 = false;
                }
                else {
                  puVar28 = (ushort *)(puVar45 + 5);
                  bVar50 = (ulong)puVar45[4] == 0;
                  uVar25 = (uint)(uVar37 - 1 < (ulong)puVar45[4]) * 3 + 0x2f;
                }
                if (bVar50) {
                  puVar34 = (ushort *)(puVar45 + sVar26);
                  uVar24 = 0x32;
                  if ((ulong)((long)puVar34 - (long)puVar28) < 3) {
                    bVar50 = false;
                    uVar37 = 0;
                  }
                  else {
                    lVar41 = 0;
                    uVar37 = 0;
                    do {
                      uVar37 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar37 << 8;
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 3);
                    puVar28 = (ushort *)((long)puVar28 + 3);
                    if ((ulong)((long)puVar34 - (long)puVar28) < uVar37) {
                      bVar50 = false;
                      uVar37 = 0;
                    }
                    else {
                      puVar35 = (ushort *)(uVar37 + (long)puVar28);
                      uVar37 = 0;
                      uVar24 = uVar25;
                      do {
                        bVar50 = true;
                        if ((ulong)((long)puVar35 - (long)puVar28) < 3) {
                          bVar51 = false;
                          uVar24 = 0x32;
                        }
                        else {
                          lVar41 = 0;
                          uVar38 = 0;
                          do {
                            uVar38 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar38 << 8;
                            lVar41 = lVar41 + 1;
                          } while (lVar41 != 3);
                          puVar29 = (ushort *)((long)puVar28 + 3);
                          if ((ulong)((long)puVar35 - (long)puVar29) < uVar38) {
                            bVar51 = false;
                            puVar28 = puVar29;
                            uVar24 = 0x32;
                          }
                          else {
                            puVar28 = (ushort *)((long)puVar29 + uVar38);
                            bVar51 = true;
                            if (uVar37 < 0x10) {
                              *(ushort **)(local_238 + uVar37 * 0x10) = puVar29;
                              *(ulong *)(local_238 + uVar37 * 0x10 + 8) = uVar38;
                              bVar50 = false;
                              uVar37 = uVar37 + 1;
                            }
                            else {
                              bVar50 = false;
                            }
                          }
                        }
                        if (!bVar51) goto LAB_001a0bfc;
                        auVar3._8_8_ = 0;
                        auVar3._0_8_ = local_2e8.len;
                        local_2e8 = (ptls_iovec_t)(auVar3 << 0x40);
                        pVar20 = local_2e8;
                        local_2e8.base._0_3_ = 0x12401;
                        pVar55 = local_2e8;
                        local_2e8._7_9_ = pVar20._7_9_;
                        local_2e8.base._0_6_ = (uint6)pVar55.base;
                        uVar23 = (uint6)local_2e8.base;
                        local_2e8.base._0_7_ = 0x8000000000000;
                        local_2e8.base._0_6_ = uVar23 | 0x3e0000000000;
                        bVar51 = true;
                        bVar50 = bVar51;
                        uVar25 = 0x32;
                        if (1 < (ulong)((long)puVar35 - (long)puVar28)) {
                          lVar41 = 0;
                          uVar38 = 0;
                          do {
                            uVar38 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar38 << 8;
                            lVar41 = lVar41 + 1;
                          } while (lVar41 != 2);
                          puVar28 = puVar28 + 1;
                          if (uVar38 <= (ulong)((long)puVar35 - (long)puVar28)) {
                            if (uVar38 == 0) {
                              bVar50 = false;
                              uVar25 = uVar24;
                            }
                            else {
                              puVar40 = (ushort *)(uVar38 + (long)puVar28);
                              puVar29 = puVar28;
                              do {
                                puVar28 = puVar29;
                                bVar50 = bVar51;
                                uVar25 = 0x32;
                                if ((long)puVar40 - (long)puVar29 < 2) goto LAB_001a0a58;
                                uVar33 = *puVar29;
                                uVar36 = uVar33 << 8 | uVar33 >> 8;
                                puVar28 = puVar29 + 1;
                                if (uVar36 < 0x40) {
                                  if ((*(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) >>
                                       (uVar36 & 7) & 1) != 0) {
                                    uVar25 = 0x2f;
                                    goto LAB_001a0a58;
                                  }
                                  *(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) =
                                       *(byte *)((long)&local_2e8 + (ulong)(uVar36 >> 3)) |
                                       (byte)(1 << ((byte)(uVar33 >> 8) & 7));
                                }
                                uVar25 = 0x32;
                                bVar50 = true;
                                if ((ulong)((long)puVar40 - (long)puVar28) < 2) {
                                  bVar13 = false;
                                }
                                else {
                                  lVar41 = 0;
                                  uVar38 = 0;
                                  do {
                                    uVar38 = (ulong)*(byte *)((long)puVar28 + lVar41) | uVar38 << 8;
                                    lVar41 = lVar41 + 1;
                                  } while (lVar41 != 2);
                                  puVar28 = puVar29 + 2;
                                  bVar50 = (ulong)((long)puVar40 - (long)puVar28) < uVar38;
                                  if (!bVar50) {
                                    puVar28 = (ushort *)((long)puVar28 + uVar38);
                                    uVar25 = 0;
                                  }
                                  bVar13 = !bVar50;
                                }
                                if (!bVar13) goto LAB_001a0a58;
                                puVar29 = puVar28;
                              } while (puVar28 != puVar40);
                              bVar50 = false;
                            }
                          }
                        }
LAB_001a0a58:
                        uVar24 = uVar25;
                        if (bVar50) goto LAB_001a0bfc;
                      } while (puVar28 != puVar35);
                      bVar50 = false;
LAB_001a0bfc:
                      bVar50 = !bVar50;
                    }
                  }
                  uVar25 = uVar24;
                  if (((bVar50) && (uVar25 = 0x32, puVar28 == puVar34)) &&
                     ((psVar9 = tls->ctx->verify_certificate,
                      psVar9 == (st_ptls_verify_certificate_t *)0x0 ||
                      (uVar25 = (*psVar9->cb)(psVar9,tls,local_248,local_250,
                                              (ptls_iovec_t *)local_238,uVar37), uVar25 == 0)))) {
                    psVar7 = tls->key_schedule;
                    if (psVar7->num_hashes != 0) {
                      pppVar44 = &psVar7->hashes[0].ctx;
                      sVar46 = 0;
                      do {
                        (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                        sVar46 = sVar46 + 1;
                        pppVar44 = pppVar44 + 2;
                      } while (sVar46 != psVar7->num_hashes);
                    }
                    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                    uVar25 = 0x202;
                  }
                }
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
              if (uVar4 == '\x0f') {
                if (uVar24 < 2) {
                  uVar25 = 0x32;
                }
                else {
                  uVar33 = *(ushort *)(puVar45 + 4) << 8 | *(ushort *)(puVar45 + 4) >> 8;
                  puVar31 = puVar45 + 6;
                  puVar10 = puVar45 + sVar26;
                  uVar25 = 0x32;
                  ppVar42 = buf_00;
                  if ((ulong)((long)puVar10 - (long)puVar31) < 2) {
LAB_001a02d4:
                    context_string = (char *)0x0;
                    puVar48 = puVar31;
                  }
                  else {
                    lVar41 = 0;
                    ppVar42 = (ptls_buffer_t *)0x0;
                    do {
                      ppVar42 = (ptls_buffer_t *)((ulong)puVar31[lVar41] | (long)ppVar42 << 8);
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 2);
                    puVar48 = puVar45 + 8;
                    puVar31 = puVar48;
                    if (puVar10 + -(long)puVar48 < ppVar42) goto LAB_001a02d4;
                    puVar31 = puVar48 + (long)ppVar42;
                    context_string = (char *)0x1;
                    uVar25 = 0;
                  }
                  if ((((char)context_string != '\0') && (uVar25 = 0x32, puVar31 == puVar10)) &&
                     ((uVar33 == 0x804 || (uVar25 = 0x2f, uVar33 == 0x403)))) {
                    sVar46 = build_certificate_verify_signdata
                                       (local_238,tls->key_schedule,context_string);
                    p_Var8 = (tls->field_15).client.certificate_verify.cb;
                    if (p_Var8 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
                      uVar25 = 0;
                    }
                    else {
                      pVar56.len = sVar46;
                      pVar56.base = local_238;
                      pVar57.len = (size_t)ppVar42;
                      pVar57.base = puVar48;
                      uVar25 = (*p_Var8)((tls->field_15).client.certificate_verify.verify_ctx,pVar56
                                         ,pVar57);
                    }
                    (*ptls_clear_memory)(local_238,sVar46);
                    (tls->field_15).client.certificate_verify.cb =
                         (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
                    if (uVar25 == 0) {
                      psVar7 = tls->key_schedule;
                      if (psVar7->num_hashes != 0) {
                        pppVar44 = &psVar7->hashes[0].ctx;
                        sVar46 = 0;
                        do {
                          (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                          sVar46 = sVar46 + 1;
                          pppVar44 = pppVar44 + 2;
                        } while (sVar46 != psVar7->num_hashes);
                      }
                      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
                      uVar25 = 0x202;
                    }
                  }
                }
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_FINISHED:
              if ((sVar46 == sVar26) && (uVar4 == '\x14')) {
                message_00.len = sVar26;
                message_00.base = puVar45;
                uVar25 = verify_finished(tls,message_00);
                if (uVar25 == 0) {
                  psVar7 = tls->key_schedule;
                  if (psVar7->num_hashes != 0) {
                    pppVar44 = &psVar7->hashes[0].ctx;
                    sVar46 = 0;
                    do {
                      (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                      sVar46 = sVar46 + 1;
                      pppVar44 = pppVar44 + 2;
                    } while (sVar46 != psVar7->num_hashes);
                  }
                  uVar25 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                  if ((((uVar25 == 0) &&
                       (uVar25 = setup_traffic_protection
                                           (tls,0,"s ap traffic","SERVER_TRAFFIC_SECRET_0"),
                       uVar25 == 0)) &&
                      (uVar25 = derive_secret(tls->key_schedule,local_238,"c ap traffic"),
                      uVar25 == 0)) && (uVar25 = derive_exporter_secret(tls,0), uVar25 == 0)) {
                    if (tls->early_data != (st_ptls_early_data_t *)0x0) {
                      if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
                        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                                      ,0x782,
                                      "int client_handle_finished(ptls_t *, ptls_buffer_t *, ptls_iovec_t)"
                                     );
                      }
                      if ((tls->field_0x138 & 4) == 0) {
                        local_2b0 = (ushort *)sendbuf->off;
                        uVar25 = ptls_buffer_reserve(sendbuf,3);
                        if (uVar25 == 0) {
                          puVar10 = sendbuf->base;
                          sVar46 = sendbuf->off;
                          puVar31 = puVar10 + sVar46;
                          puVar31[0] = '\x16';
                          puVar31[1] = '\x03';
                          puVar10[sVar46 + 2] = '\x03';
                          sendbuf->off = sendbuf->off + 3;
                          uVar25 = 0;
                        }
                        bVar50 = true;
                        if (uVar25 == 0) {
                          uVar25 = ptls_buffer_reserve(sendbuf,2);
                          if (uVar25 == 0) {
                            puVar31 = sendbuf->base;
                            sVar46 = sendbuf->off;
                            (puVar31 + sVar46)[0] = '\0';
                            (puVar31 + sVar46)[1] = '\0';
                            sendbuf->off = sendbuf->off + 2;
                            uVar25 = 0;
                          }
                          bVar50 = true;
                          if (uVar25 == 0) {
                            sVar46 = sendbuf->off;
                            uVar25 = ptls_buffer_reserve(sendbuf,1);
                            if (uVar25 == 0) {
                              sendbuf->base[sendbuf->off] = '\x05';
                              sendbuf->off = sendbuf->off + 1;
                              uVar25 = 0;
                            }
                            bVar50 = true;
                            if (uVar25 == 0) {
                              uVar25 = ptls_buffer_reserve(sendbuf,3);
                              if (uVar25 == 0) {
                                puVar31 = sendbuf->base;
                                sVar11 = sendbuf->off;
                                puVar31[sVar11 + 2] = '\0';
                                puVar31 = puVar31 + sVar11;
                                puVar31[0] = '\0';
                                puVar31[1] = '\0';
                                sendbuf->off = sendbuf->off + 3;
                                uVar25 = 0;
                              }
                              bVar50 = true;
                              if (uVar25 == 0) {
                                sVar11 = sendbuf->off;
                                lVar41 = -3;
                                do {
                                  sendbuf->base[lVar41 + sVar11] = '\0';
                                  lVar41 = lVar41 + 1;
                                } while (lVar41 != 0);
                                bVar50 = false;
                              }
                              if (uVar25 == 0) {
                                local_280 = tls->key_schedule;
                                bVar50 = false;
                                if ((local_280 != (st_ptls_key_schedule_t *)0x0) &&
                                   (local_280->num_hashes != 0)) {
                                  local_270 = sendbuf->base + sVar46;
                                  sVar11 = sendbuf->off;
                                  pppVar44 = &local_280->hashes[0].ctx;
                                  sVar49 = 0;
                                  do {
                                    (*(*pppVar44)->update)(*pppVar44,local_270,sVar11 - sVar46);
                                    sVar49 = sVar49 + 1;
                                    pppVar44 = pppVar44 + 2;
                                    bVar50 = false;
                                  } while (sVar49 != local_280->num_hashes);
                                }
                              }
                            }
                            if (!bVar50) {
                              uVar37 = sendbuf->off - sVar46;
                              lVar41 = 8;
                              do {
                                sendbuf->base[sVar46 - 2] =
                                     (uint8_t)(uVar37 >> ((byte)lVar41 & 0x3f));
                                lVar41 = lVar41 + -8;
                                sVar46 = sVar46 + 1;
                              } while (lVar41 != -8);
                              bVar50 = false;
                            }
                          }
                          if (!bVar50) {
                            uVar25 = buffer_encrypt_record(sendbuf,(size_t)local_2b0,local_260);
                            bVar50 = uVar25 != 0;
                          }
                        }
                        if (bVar50) goto LAB_001a070a;
                        if (bVar50) break;
                      }
                      uVar25 = retire_early_data_secret(tls,1);
                      if (uVar25 != 0) goto LAB_001a070a;
                    }
                    uVar25 = push_change_cipher_spec(tls,sendbuf);
                    if (uVar25 == 0) {
                      send_finished(tls,sendbuf);
                      *(undefined1 (*) [8])(local_260->secret + 0x30) = local_208;
                      *(undefined8 *)(local_260->secret + 0x38) = auStack_200._0_8_;
                      *(uint8_t **)(local_260->secret + 0x20) = local_218.base;
                      *(size_t *)(local_260->secret + 0x28) = local_218.len;
                      *(undefined8 *)(local_260->secret + 0x10) = local_228._0_8_;
                      *(undefined8 *)(local_260->secret + 0x18) = local_228._8_8_;
                      *(undefined1 (*) [8])local_260->secret = local_238;
                      *(uint8_t **)(local_260->secret + 8) = puStack_230;
                      uVar25 = setup_traffic_protection(tls,1,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0")
                      ;
                      if (uVar25 == 0) {
                        tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
                        uVar25 = 0;
                      }
                    }
                  }
                }
LAB_001a070a:
                (*ptls_clear_memory)(local_238,0x40);
              }
              break;
            case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
            case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
              uVar25 = 0x28;
              if ((sVar46 == sVar26) && (uVar4 == '\x01')) {
                message.len = sVar26;
                message.base = puVar45;
                uVar25 = server_handle_hello(tls,sendbuf,message,local_290);
              }
              break;
            case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
              if ((uVar4 == '\x05') && (uVar25 = retire_early_data_secret(tls,0), uVar25 == 0)) {
                psVar7 = tls->key_schedule;
                if (psVar7->num_hashes != 0) {
                  pppVar44 = &psVar7->hashes[0].ctx;
                  sVar46 = 0;
                  do {
                    (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                    sVar46 = sVar46 + 1;
                    pppVar44 = pppVar44 + 2;
                  } while (sVar46 != psVar7->num_hashes);
                }
                tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                uVar25 = 0x202;
              }
              break;
            case PTLS_STATE_SERVER_EXPECT_FINISHED:
              uVar25 = 0x28;
              if (((sVar46 == sVar26) && (uVar4 == '\x14')) &&
                 (message_01.len = sVar26, message_01.base = puVar45,
                 uVar25 = verify_finished(tls,message_01), uVar25 == 0)) {
                uVar14 = *(undefined8 *)local_240;
                uVar15 = *(undefined8 *)((long)local_240 + 8);
                ppVar16 = (local_240->client).key_share_ctx;
                p_Var8 = (local_240->client).certificate_verify.cb;
                pvVar17 = (local_240->client).certificate_verify.verify_ctx;
                uVar18 = *(undefined8 *)((long)local_240 + 0x28);
                uVar19 = *(undefined8 *)((long)local_240 + 0x38);
                *(undefined8 *)((tls->traffic_protection).dec.secret + 0x30) =
                     *(undefined8 *)((long)local_240 + 0x30);
                *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar19;
                *(void **)((tls->traffic_protection).dec.secret + 0x20) = pvVar17;
                *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar18;
                *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x10) =
                     ppVar16;
                *(_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)
                 ((tls->traffic_protection).dec.secret + 0x18) = p_Var8;
                *(undefined8 *)(tls->traffic_protection).dec.secret = uVar14;
                *(undefined8 *)((tls->traffic_protection).dec.secret + 8) = uVar15;
                (*ptls_clear_memory)(local_240,0x40);
                uVar25 = setup_traffic_protection(tls,0,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0");
                if (uVar25 == 0) {
                  psVar7 = tls->key_schedule;
                  if (psVar7->num_hashes != 0) {
                    pppVar44 = &psVar7->hashes[0].ctx;
                    sVar46 = 0;
                    do {
                      (*(*pppVar44)->update)(*pppVar44,puVar45,sVar26);
                      sVar46 = sVar46 + 1;
                      pppVar44 = pppVar44 + 2;
                    } while (sVar46 != psVar7->num_hashes);
                  }
                  tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
                  uVar25 = 0;
                }
              }
              break;
            case PTLS_STATE_CLIENT_POST_HANDSHAKE:
              if (uVar4 == '\x04') {
                uVar25 = decode_new_session_ticket
                                   ((uint32_t *)&local_2e8,local_288,&local_2c0,
                                    (ptls_iovec_t *)local_238,&local_274,puVar45 + 4,
                                    puVar45 + sVar26);
                if (uVar25 == 0) {
                  if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
                    uVar25 = 0;
                  }
                  else {
                    local_2e8.len = 0x200;
                    local_2e8.base = local_238;
                    local_2d8._0_12_ = ZEXT812(0);
                    psVar5 = tls->ctx->get_time;
                    uVar27 = (*psVar5->cb)(psVar5);
                    uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,8);
                    if (uVar24 == 0) {
                      *(uint64_t *)(local_2e8.base + local_2d8._0_8_) =
                           uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                           (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                           (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                           (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
                      local_2d8._0_8_ = local_2d8._0_8_ + 8;
                      uVar24 = 0;
                    }
                    if (uVar24 == 0) {
                      uVar33 = tls->key_share->id;
                      uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,2);
                      if (uVar24 == 0) {
                        *(ushort *)(local_2e8.base + local_2d8._0_8_) = uVar33 << 8 | uVar33 >> 8;
                        local_2d8._0_8_ = local_2d8._0_8_ + 2;
                        uVar24 = 0;
                      }
                      if (uVar24 == 0) {
                        uVar33 = tls->cipher_suite->id;
                        uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,2);
                        if (uVar24 == 0) {
                          *(ushort *)(local_2e8.base + local_2d8._0_8_) = uVar33 << 8 | uVar33 >> 8;
                          local_2d8._0_8_ = local_2d8._0_8_ + 2;
                          uVar24 = 0;
                        }
                        if (uVar24 == 0) {
                          uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,3);
                          if (uVar24 == 0) {
                            local_2e8.base[local_2d8._0_8_ + 2] = '\0';
                            (local_2e8.base + local_2d8._0_8_)[0] = '\0';
                            (local_2e8.base + local_2d8._0_8_)[1] = '\0';
                            local_2d8._0_8_ = local_2d8._0_8_ + 3;
                            uVar24 = 0;
                          }
                          iVar30 = 6;
                          if (uVar24 == 0) {
                            uVar14 = local_2d8._0_8_;
                            uVar24 = ptls_buffer__do_pushv
                                               ((ptls_buffer_t *)&local_2e8,puVar45 + 4,uVar37);
                            if (uVar24 == 0) {
                              puVar31 = local_2e8.base + (uVar14 - 3);
                              lVar41 = 0x10;
                              do {
                                *puVar31 = (uint8_t)((ulong)(local_2d8._0_8_ - uVar14) >>
                                                    ((byte)lVar41 & 0x3f));
                                lVar41 = lVar41 + -8;
                                puVar31 = puVar31 + 1;
                              } while (lVar41 != -8);
                              iVar30 = 0;
                            }
                          }
                          if (iVar30 != 6) {
                            if (iVar30 != 0) break;
                            uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,2);
                            if (uVar24 == 0) {
                              (local_2e8.base + local_2d8._0_8_)[0] = '\0';
                              (local_2e8.base + local_2d8._0_8_)[1] = '\0';
                              local_2d8._0_8_ = local_2d8._0_8_ + 2;
                              uVar24 = 0;
                            }
                            iVar30 = 6;
                            if (uVar24 == 0) {
                              uVar14 = local_2d8._0_8_;
                              uVar24 = ptls_buffer_reserve((ptls_buffer_t *)&local_2e8,
                                                           (tls->key_schedule->hashes[0].algo)->
                                                           digest_size);
                              if (uVar24 == 0) {
                                puVar31 = local_2e8.base;
                                uVar15 = local_2d8._0_8_;
                                pVar20.len = local_2c0.len;
                                pVar20.base = local_2c0.base;
                                uVar24 = derive_resumption_secret
                                                   (tls->key_schedule,
                                                    local_2e8.base + local_2d8._0_8_,pVar20);
                                if (uVar24 == 0) {
                                  lVar43 = uVar15 + (tls->key_schedule->hashes[0].algo)->digest_size
                                  ;
                                  local_2d8._0_8_ = lVar43;
                                  puVar31 = puVar31 + (uVar14 - 2);
                                  lVar41 = 8;
                                  do {
                                    *puVar31 = (uint8_t)((ulong)(lVar43 - uVar14) >>
                                                        ((byte)lVar41 & 0x3f));
                                    lVar41 = lVar41 + -8;
                                    puVar31 = puVar31 + 1;
                                  } while (lVar41 != -8);
                                  iVar30 = 0;
                                  uVar24 = 0;
                                }
                              }
                            }
                            if (iVar30 != 6) {
                              if (iVar30 != 0) break;
                              psVar12 = tls->ctx->save_ticket;
                              pVar55.len = local_2d8._0_8_;
                              pVar55.base = local_2e8.base;
                              uVar24 = (*psVar12->cb)(psVar12,tls,pVar55);
                            }
                          }
                        }
                      }
                    }
                    puVar31 = local_2e8.base;
                    (*ptls_clear_memory)(local_2e8.base,local_2d8._0_8_);
                    if (local_2d8._8_4_ != 0) {
                      free(puVar31);
                    }
                    local_2d8 = (undefined1  [16])0x0;
                    local_2e8.base = (uint8_t *)0x0;
                    local_2e8.len = 0;
                    uVar25 = uVar24;
                  }
                }
              }
              break;
            case PTLS_STATE_SERVER_POST_HANDSHAKE:
              break;
            }
            if ((uVar25 == 0) || (uVar25 == 0x202)) {
              puVar45 = puVar45 + sVar26;
              iVar30 = 0;
            }
            else {
              ptls_buffer__release_memory(buf_00);
              (tls->recvbuf).mess.off = 0;
              (tls->recvbuf).mess.is_allocated = 0;
              *(undefined4 *)&(tls->recvbuf).mess.field_0x1c = 0;
              buf_00->base = (uint8_t *)0x0;
              buf_00->capacity = 0;
              iVar30 = 1;
              local_264 = uVar25;
            }
          }
        } while (iVar30 == 0);
        uVar24 = local_264;
        if (iVar30 == 3) {
LAB_001a18ee:
          if (puVar45 == puVar47) {
            ptls_buffer__release_memory(buf_00);
            (tls->recvbuf).mess.off = 0;
            (tls->recvbuf).mess.is_allocated = 0;
            *(undefined4 *)&(tls->recvbuf).mess.field_0x1c = 0;
            buf_00->base = (uint8_t *)0x0;
            buf_00->capacity = 0;
            uVar24 = uVar25;
          }
          else {
            if (buf_00->base == (uint8_t *)0x0) {
              (tls->recvbuf).mess.base = "";
              local_290 = (ptls_handshake_properties_t *)(puVar47 + -(long)puVar45);
              (tls->recvbuf).mess.capacity = 0;
              (tls->recvbuf).mess.off = 0;
              (tls->recvbuf).mess.is_allocated = 0;
              uVar24 = ptls_buffer_reserve(buf_00,(size_t)local_290);
              if (uVar24 != 0) goto LAB_001a193d;
              memcpy(buf_00->base,puVar45,(size_t)local_290);
            }
            else {
              memmove(buf_00->base,puVar45,(long)puVar47 - (long)puVar45);
            }
            (tls->recvbuf).mess.off = (long)puVar47 - (long)puVar45;
            uVar24 = 0x202;
          }
        }
      }
    }
    else if (local_2a8[0] == '\x15') {
      uVar24 = 0x32;
      if (local_2a8._8_8_ == 2) {
        uVar25 = local_298[1] | 0x100;
        uVar24 = 0;
        if (local_298[1] != 0x5a) {
          uVar24 = uVar25;
        }
        if (*local_298 != '\x01') {
          uVar24 = uVar25;
        }
      }
    }
    else {
      uVar24 = 10;
      if (local_2a8[0] == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
             (uVar24 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
            decryptbuf->off = decryptbuf->off + local_2a8._8_8_;
          }
        }
        else {
          decryptbuf->off = decryptbuf->off + local_2a8._8_8_;
          uVar24 = 0;
        }
      }
    }
  }
LAB_001a193d:
  ptls_buffer__release_memory(&buf->rec);
  (tls->recvbuf).rec.off = 0;
  (tls->recvbuf).rec.is_allocated = 0;
  *(undefined4 *)&(tls->recvbuf).rec.field_0x1c = 0;
  (buf->rec).base = (uint8_t *)0x0;
  (buf->rec).capacity = 0;
  return uVar24;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &rec.length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->skip_early_data) {
                ret = PTLS_ERROR_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->skip_early_data) {
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, handle_handshake_message, sendbuf, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}